

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

_Bool mul_u16n(uint16_t *r,uint16_t *a,uint16_t *b,size_t nr,size_t na,size_t nb)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  uint16_t *puVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  uint16_t *puVar11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  uint uVar15;
  
  if (nr != 0) {
    memset(r,0,nr * 2);
  }
  if (na == 0) {
    _Var3 = false;
  }
  else {
    puVar4 = r + -2;
    sVar5 = 1;
    _Var3 = false;
    sVar9 = na;
    do {
      sVar10 = sVar9 - 1;
      if (nb != 0) {
        puVar11 = puVar4;
        sVar12 = sVar5;
        sVar13 = nb;
        do {
          uVar6 = (nb - sVar13) + (na - sVar9);
          if (nr <= uVar6) {
            _Var3 = true;
            break;
          }
          lVar7 = ~uVar6 + nr;
          uVar1 = a[sVar10];
          uVar2 = b[sVar13 - 1];
          uVar14 = ((uint)uVar2 * (uint)uVar1 & 0xffff) + (uint)r[lVar7];
          r[lVar7] = (uint16_t)uVar14;
          uVar14 = (uVar14 >> 0x10) + ((uint)uVar2 * (uint)uVar1 >> 0x10);
          sVar8 = nr;
          if (uVar14 != 0) {
            do {
              if (sVar12 == sVar8) {
                _Var3 = true;
                break;
              }
              uVar15 = uVar14 + puVar11[sVar8];
              puVar11[sVar8] = (uint16_t)uVar15;
              uVar14 = uVar15 >> 0x10;
              sVar8 = sVar8 - 1;
            } while (0xffff < uVar15);
          }
          sVar13 = sVar13 - 1;
          sVar12 = sVar12 + 1;
          puVar11 = puVar11 + -1;
        } while (sVar13 != 0);
      }
      sVar5 = sVar5 + 1;
      puVar4 = puVar4 + -1;
      sVar9 = sVar10;
    } while (sVar10 != 0);
  }
  return _Var3;
}

Assistant:

static bool mul_u16n(uint16_t *r, const uint16_t *a, const uint16_t *b,
		size_t nr, size_t na, size_t nb)
{
	const uint32_t mask = ((uint32_t)1 << 16) - 1;
	size_t ia = na;
	bool over = false;

	zer_u16n(r, nr);
	while (ia > 0) {
		size_t ib = nb;

		--ia;
		while (ib > 0) {
			size_t rir = (na - 1 - ia) + (nb - ib), ir;
			uint32_t p, carry, t;

			if (rir >= nr) {
				over = true;
				break;
			}
			--ib;
			ir = (nr - rir) - 1;
			p = (uint32_t)a[ia] * (uint32_t)b[ib];
			carry = p >> 16;
			t = (uint32_t)r[ir] + (p & mask);
			r[ir] = t & mask;
			carry += t >> 16;
			while (carry > 0) {
				if (ir == 0) {
					over = true;
					break;
				}
				--ir;
				t = (uint32_t)r[ir] + carry;
				r[ir] = t & mask;
				carry = t >> 16;
			}
		}
	}
	return over;
}